

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::StreamingConcatenationExpressionSyntax
          (StreamingConcatenationExpressionSyntax *this,Token openBrace,Token operatorToken,
          ExpressionSyntax *sliceSize,Token innerOpenBrace,
          SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *expressions,
          Token innerCloseBrace,Token closeBrace)

{
  undefined4 uVar1;
  bool bVar2;
  StreamExpressionSyntax *pSVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  undefined8 in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  SyntaxNode *in_stack_00000020;
  StreamExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *__range2;
  undefined4 in_stack_ffffffffffffff78;
  SyntaxKind in_stack_ffffffffffffff7c;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *this_00;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)&stack0x00000008;
  PrimaryExpressionSyntax::PrimaryExpressionSyntax
            ((PrimaryExpressionSyntax *)this_00,in_stack_ffffffffffffff7c);
  *(undefined8 *)(in_RDI + 1) = in_RSI;
  in_RDI[1].parent = in_RDX;
  in_RDI[1].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 2) = in_R8;
  in_RDI[2].parent = in_R9;
  in_RDI[2].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[3].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[3].field_0x4 = uVar1;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::SeparatedSyntaxList
            (this_00,(SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  in_RDI[5].previewNode = in_stack_00000020;
  *(StreamExpressionSyntax **)(in_RDI + 6) = child;
  in_RDI[6].parent = (SyntaxNode *)__end2.list;
  in_RDI[6].previewNode = (SyntaxNode *)__end2.index;
  if (in_RDI[2].parent != (SyntaxNode *)0x0) {
    (in_RDI[2].parent)->parent = in_RDI;
  }
  *(SyntaxNode **)(in_RDI + 4) = in_RDI;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)0x2b3e0e);
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::end(this_00);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::StreamExpressionSyntax_*> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pSVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_false>
                          *)0x2b3e4d);
    (pSVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

StreamingConcatenationExpressionSyntax(Token openBrace, Token operatorToken, ExpressionSyntax* sliceSize, Token innerOpenBrace, const SeparatedSyntaxList<StreamExpressionSyntax>& expressions, Token innerCloseBrace, Token closeBrace) :
        PrimaryExpressionSyntax(SyntaxKind::StreamingConcatenationExpression), openBrace(openBrace), operatorToken(operatorToken), sliceSize(sliceSize), innerOpenBrace(innerOpenBrace), expressions(expressions), innerCloseBrace(innerCloseBrace), closeBrace(closeBrace) {
        if (this->sliceSize) this->sliceSize->parent = this;
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
    }